

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

void __thiscall despot::TagPOMCPPrior::ComputePreference(TagPOMCPPrior *this,State *state)

{
  BaseTag *pBVar1;
  value_type_conflict1 vVar2;
  ACT_TYPE AVar3;
  size_t sVar4;
  OBS_TYPE OVar5;
  undefined8 uVar6;
  ulong uVar7;
  value_type_conflict1 local_2c;
  ACT_TYPE local_28;
  int a_1;
  undefined8 uStack_20;
  int a;
  Coord rob;
  State *state_local;
  TagPOMCPPrior *this_local;
  
  _rob = state;
  uStack_20 = BaseTag::GetRobPos(this->tag_model_,state);
  std::vector<int,_std::allocator<int>_>::clear
            ((vector<int,_std::allocator<int>_> *)&this->field_0x60);
  std::vector<int,_std::allocator<int>_>::clear
            ((vector<int,_std::allocator<int>_> *)&this->field_0x48);
  for (a_1 = 0; a_1 < 5; a_1 = a_1 + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&this->field_0x60,&a_1);
  }
  sVar4 = History::Size((History *)&this->field_0x10);
  if (sVar4 != 0) {
    OVar5 = History::LastObservation((History *)&this->field_0x10);
    if (OVar5 == this->tag_model_->same_loc_obs_) {
      local_28 = BaseTag::TagAction(this->tag_model_);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&this->field_0x48,&local_28);
    }
    else if ((this->tag_model_->robot_pos_unknown_ & 1U) != 0) {
      for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
        pBVar1 = this->tag_model_;
        uVar6 = despot::operator+((Coord *)&stack0xffffffffffffffe0,
                                  (Coord *)(&Compass::DIRECTIONS + local_2c));
        uVar7 = despot::Floor::Inside(&pBVar1->floor_,uVar6);
        vVar2 = local_2c;
        if ((uVar7 & 1) != 0) {
          AVar3 = History::LastAction((History *)&this->field_0x10);
          uVar7 = despot::Compass::Opposite(vVar2,AVar3);
          if ((uVar7 & 1) == 0) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)&this->field_0x48,&local_2c);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ComputePreference(const State& state) {
		Coord rob = tag_model_->GetRobPos(&state);

		legal_actions_.clear();
		preferred_actions_.clear();

		for (int a = 0; a < 5; a++) {
			legal_actions_.push_back(a);
		}

		if (history_.Size() != 0) {
			if (history_.LastObservation() == tag_model_->same_loc_obs_) {
				preferred_actions_.push_back(tag_model_->TagAction());
			} else {
				if (tag_model_->robot_pos_unknown_) {
					for (int a = 0; a < 4; a++) {
						if (tag_model_->floor_.Inside(
							rob + Compass::DIRECTIONS[a])) {
							if (!Compass::Opposite(a, history_.LastAction()))
								preferred_actions_.push_back(a);
						}
					}
				}
			}
		}
	}